

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::SceneGraphFlattener
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *in,InstancingMode instancing)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  undefined8 *puVar3;
  void *pvVar4;
  GroupNode *this_00;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  Transformations local_68;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_38;
  
  (this->node).ptr = (Node *)0x0;
  p_Var1 = &(this->object_mapping)._M_t._M_impl.super__Rb_tree_header;
  (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unique_id)._M_t._M_impl.super__Rb_tree_header;
  (this->unique_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unique_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->unique_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->unique_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->unique_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*(in->ptr->super_RefCount)._vptr_RefCount[6])();
  (*(in->ptr->super_RefCount)._vptr_RefCount[7])(in->ptr,(ulong)(instancing == INSTANCING_GROUP));
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (instancing == INSTANCING_NONE) {
    local_68.time_range.lower = 0.0;
    local_68.time_range.upper = 1.0;
    local_68.spaces.size_active = 0;
    local_68.spaces.size_alloced._0_1_ = 0;
    local_68.spaces.size_alloced._1_7_ = 0;
    local_68.spaces.items._0_1_ = 0;
    local_68.spaces.items._1_7_ = 0;
    local_68.quaternion = false;
    pvVar4 = alignedMalloc(0x40,0x10);
    local_68.spaces.items._0_1_ = SUB81(pvVar4,0);
    local_68.spaces.items._1_7_ = (undefined7)((ulong)pvVar4 >> 8);
    alignedFree((void *)0x0);
    local_68.spaces.size_alloced._0_1_ = 1;
    local_68.spaces.size_alloced._1_7_ = 0;
    puVar3 = (undefined8 *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_);
    local_68.spaces.size_active = 1;
    *puVar3 = 0x3f800000;
    puVar3[1] = 0;
    puVar3[2] = 0x3f80000000000000;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0x3f800000;
    puVar3[6] = 0;
    puVar3[7] = 0x3f80000000000000;
    convertGeometries(this,&local_38,in,&local_68);
    alignedFree((void *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_));
    local_68.time_range.lower = 0.0;
    local_68.time_range.upper = 1.0;
    local_68.spaces.size_active = 0;
    local_68.spaces.size_alloced._0_1_ = 0;
    local_68.spaces.size_alloced._1_7_ = 0;
    local_68.spaces.items._0_1_ = 0;
    local_68.spaces.items._1_7_ = 0;
    local_68.quaternion = false;
    pvVar4 = alignedMalloc(0x40,0x10);
    local_68.spaces.items._0_1_ = SUB81(pvVar4,0);
    local_68.spaces.items._1_7_ = (undefined7)((ulong)pvVar4 >> 8);
    alignedFree((void *)0x0);
    local_68.spaces.size_alloced._0_1_ = 1;
    local_68.spaces.size_alloced._1_7_ = 0;
    puVar3 = (undefined8 *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_);
    local_68.spaces.size_active = 1;
    *puVar3 = 0x3f800000;
    puVar3[1] = 0;
    puVar3[2] = 0x3f80000000000000;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0x3f800000;
    puVar3[6] = 0;
    puVar3[7] = 0x3f80000000000000;
    convertLightsAndCameras(this,&local_38,in,&local_68);
    alignedFree((void *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_));
  }
  else {
    if (instancing == INSTANCING_MULTI_LEVEL) {
      convertMultiLevelInstances(this,&local_38,in);
    }
    else if (instancing == INSTANCING_FLATTENED) {
      convertFlattenedInstances(this,&local_38,in);
    }
    else {
      local_68.time_range.lower = 0.0;
      local_68.time_range.upper = 1.0;
      local_68.spaces.size_active = 0;
      local_68.spaces.size_alloced._0_1_ = 0;
      local_68.spaces.size_alloced._1_7_ = 0;
      local_68.spaces.items._0_1_ = 0;
      local_68.spaces.items._1_7_ = 0;
      local_68.quaternion = false;
      pvVar4 = alignedMalloc(0x40,0x10);
      local_68.spaces.items._0_1_ = SUB81(pvVar4,0);
      local_68.spaces.items._1_7_ = (undefined7)((ulong)pvVar4 >> 8);
      alignedFree((void *)0x0);
      local_68.spaces.size_alloced._0_1_ = 1;
      local_68.spaces.size_alloced._1_7_ = 0;
      puVar3 = (undefined8 *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_);
      local_68.spaces.size_active = 1;
      *puVar3 = 0x3f800000;
      puVar3[1] = 0;
      puVar3[2] = 0x3f80000000000000;
      puVar3[3] = 0;
      puVar3[4] = 0;
      puVar3[5] = 0x3f800000;
      puVar3[6] = 0;
      puVar3[7] = 0x3f80000000000000;
      convertInstances(this,&local_38,in,&local_68);
      alignedFree((void *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_));
    }
    local_68.time_range.lower = 0.0;
    local_68.time_range.upper = 1.0;
    local_68.spaces.size_active = 0;
    local_68.spaces.size_alloced._0_1_ = 0;
    local_68.spaces.size_alloced._1_7_ = 0;
    local_68.spaces.items._0_1_ = 0;
    local_68.spaces.items._1_7_ = 0;
    local_68.quaternion = false;
    pvVar4 = alignedMalloc(0x40,0x10);
    local_68.spaces.items._0_1_ = SUB81(pvVar4,0);
    local_68.spaces.items._1_7_ = (undefined7)((ulong)pvVar4 >> 8);
    alignedFree((void *)0x0);
    local_68.spaces.size_alloced._0_1_ = 1;
    local_68.spaces.size_alloced._1_7_ = 0;
    puVar3 = (undefined8 *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_);
    local_68.spaces.size_active = 1;
    *puVar3 = 0x3f800000;
    puVar3[1] = 0;
    puVar3[2] = 0x3f80000000000000;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0x3f800000;
    puVar3[6] = 0;
    puVar3[7] = 0x3f80000000000000;
    convertLightsAndCameras(this,&local_38,in,&local_68);
    alignedFree((void *)CONCAT71(local_68.spaces.items._1_7_,local_68.spaces.items._0_1_));
  }
  (*(in->ptr->super_RefCount)._vptr_RefCount[8])();
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,&local_38);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  pNVar2 = (this->node).ptr;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
  }
  (this->node).ptr = (Node *)this_00;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

SceneGraphFlattener (Ref<SceneGraph::Node> in, SceneGraph::InstancingMode instancing)
    {
      in->calculateInDegree();
      in->calculateClosed(instancing == SceneGraph::INSTANCING_GROUP);

      std::vector<Ref<SceneGraph::Node>> geometries;      
      if (instancing != SceneGraph::INSTANCING_NONE) 
      {
        if      (instancing == SceneGraph::INSTANCING_FLATTENED  ) convertFlattenedInstances(geometries,in);
        else if (instancing == SceneGraph::INSTANCING_MULTI_LEVEL) convertMultiLevelInstances(geometries,in);
        else                                                       convertInstances(geometries,in,one);
        convertLightsAndCameras(geometries,in,one);
      }
      else
      {
        convertGeometries(geometries,in,one);
        convertLightsAndCameras(geometries,in,one);
      }
      in->resetInDegree();
      
      node = new SceneGraph::GroupNode(geometries);
    }